

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

aiString * __thiscall
Assimp::FBX::FBXConverter::GetTexturePath
          (aiString *__return_storage_ptr__,FBXConverter *this,Texture *tex)

{
  ulong __n;
  key_type *__k;
  bool bVar1;
  uint uVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  uint unaff_EBP;
  
  __return_storage_ptr__->length = 0;
  __return_storage_ptr__->data[0] = '\0';
  memset(__return_storage_ptr__->data + 1,0x1b,0x3ff);
  __n = (tex->relativeFileName)._M_string_length;
  if (__n < 0x400) {
    __return_storage_ptr__->length = (ai_uint32)__n;
    memcpy(__return_storage_ptr__->data,(tex->relativeFileName)._M_dataplus._M_p,__n);
    __return_storage_ptr__->data[__n] = '\0';
  }
  __k = tex->media;
  if (__k == (key_type *)0x0) {
    return __return_storage_ptr__;
  }
  iVar3 = std::
          _Rb_tree<const_Assimp::FBX::Video,_std::pair<const_Assimp::FBX::Video,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>,_std::less<const_Assimp::FBX::Video>,_std::allocator<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>_>
          ::find(&(this->textures_converted)._M_t,__k);
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(this->textures_converted)._M_t._M_impl.super__Rb_tree_header) {
    if (__k->contentLength == 0) {
      bVar1 = false;
      goto LAB_0051ba5d;
    }
    unaff_EBP = ConvertVideo(this,__k);
    pmVar4 = std::
             map<const_Assimp::FBX::Video,_unsigned_int,_std::less<const_Assimp::FBX::Video>,_std::allocator<std::pair<const_Assimp::FBX::Video,_unsigned_int>_>_>
             ::operator[](&this->textures_converted,__k);
    *pmVar4 = unaff_EBP;
  }
  else {
    unaff_EBP = *(uint *)&iVar3._M_node[6]._M_right;
  }
  bVar1 = true;
LAB_0051ba5d:
  if ((bVar1) && (this->doc->settings->useLegacyEmbeddedTextureNaming != false)) {
    __return_storage_ptr__->data[0] = '*';
    uVar2 = ASSIMP_itoa10(__return_storage_ptr__->data + 1,0x3ff,unaff_EBP);
    __return_storage_ptr__->length = uVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

aiString FBXConverter::GetTexturePath(const Texture* tex)
        {
            aiString path;
            path.Set(tex->RelativeFilename());

            const Video* media = tex->Media();
            if (media != nullptr) {
                bool textureReady = false; //tells if our texture is ready (if it was loaded or if it was found)
                unsigned int index;

                VideoMap::const_iterator it = textures_converted.find(*media);
                if (it != textures_converted.end()) {
                    index = (*it).second;
                    textureReady = true;
                }
                else {
                    if (media->ContentLength() > 0) {
                        index = ConvertVideo(*media);
                        textures_converted[*media] = index;
                        textureReady = true;
                    }
                }

                // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture), if the texture is ready
                if (doc.Settings().useLegacyEmbeddedTextureNaming) {
                    if (textureReady) {
                        // TODO: check the possibility of using the flag "AI_CONFIG_IMPORT_FBX_EMBEDDED_TEXTURES_LEGACY_NAMING"
                        // In FBX files textures are now stored internally by Assimp with their filename included
                        // Now Assimp can lookup through the loaded textures after all data is processed
                        // We need to load all textures before referencing them, as FBX file format order may reference a texture before loading it
                        // This may occur on this case too, it has to be studied
                        path.data[0] = '*';
                        path.length = 1 + ASSIMP_itoa10(path.data + 1, MAXLEN - 1, index);
                    }
                }
            }

            return path;
        }